

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress_bar_test.cpp
# Opt level: O0

void __thiscall
biosoup::test::BiosoupProgressBarTest_Operator_Test::~BiosoupProgressBarTest_Operator_Test
          (BiosoupProgressBarTest_Operator_Test *this)

{
  BiosoupProgressBarTest_Operator_Test *this_local;
  
  ~BiosoupProgressBarTest_Operator_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(BiosoupProgressBarTest, Operator) {
  ProgressBar pb{8, 8};
  EXPECT_EQ("        ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>      ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==>     ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("===>    ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("====>   ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=====>  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("======> ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=======>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("========", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("========", ::testing::PrintToString(pb));

  pb = {8, 9};
  EXPECT_EQ("        ", ::testing::PrintToString(pb));

  pb = {8, 7};
  EXPECT_EQ("       ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("       ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>     ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==>    ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("===>   ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("====>  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=====> ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("======>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=======", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=======", ::testing::PrintToString(pb));

  pb = {8, 4};
  EXPECT_EQ("    ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("    ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==> ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("==> ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("===>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("===>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("====", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("====", ::testing::PrintToString(pb));

  pb = {8, 2};
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("  ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=>", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("==", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("==", ::testing::PrintToString(pb));

  pb = {8, 1};
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
  EXPECT_TRUE(++pb);
  EXPECT_EQ("=", ::testing::PrintToString(pb));
  EXPECT_FALSE(++pb);
  EXPECT_EQ("=", ::testing::PrintToString(pb));

  pb = {8, 0};
  EXPECT_EQ(" ", ::testing::PrintToString(pb));
}